

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O2

uint __thiscall PacketReader::GetNumber(PacketReader *this,size_t length)

{
  uint uVar1;
  ulong __n;
  array<unsigned_char,_4UL> bytes;
  uchar local_1c [4];
  
  local_1c[0] = 0xfe;
  local_1c[1] = 0xfe;
  local_1c[2] = 0xfe;
  local_1c[3] = 0xfe;
  __n = (this->data)._M_string_length - this->pos;
  if (length <= __n) {
    __n = length;
  }
  std::
  copy_n<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long,unsigned_char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )((this->data)._M_dataplus._M_p + this->pos),__n,local_1c);
  this->pos = this->pos + length;
  uVar1 = PacketProcessor::Number(local_1c[0],local_1c[1],local_1c[2],local_1c[3]);
  return uVar1;
}

Assistant:

unsigned int PacketReader::GetNumber(std::size_t length)
{
	std::array<unsigned char, 4> bytes{{254, 254, 254, 254}};

	std::copy_n(util::cbegin(this->data) + this->pos, std::min(length, this->Remaining()), util::begin(bytes));

	this->pos += length;

	return PacketProcessor::Number(bytes[0], bytes[1], bytes[2], bytes[3]);
}